

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

void __thiscall
cmCTestTestHandler::PrintLabelOrSubprojectSummary(cmCTestTestHandler *this,bool doSubProject)

{
  _Rb_tree_node_base *__k;
  int iVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pbVar4;
  cmCTest *pcVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  mapped_type_conflict3 *pmVar7;
  mapped_type_conflict *pmVar8;
  const_iterator cVar9;
  ostream *poVar10;
  size_t sVar11;
  _Base_ptr p_Var12;
  string *l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  string *l_1;
  pointer __k_00;
  char cVar13;
  ulong uVar14;
  cmCTestTestProperties *p;
  pointer pcVar15;
  pointer pcVar16;
  string label;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subprojects;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labelCounts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  labelTimes;
  ostringstream labelCountStr;
  ostringstream cmCTestLog_msg;
  ostringstream cmCTestLog_msg_2;
  long *local_818;
  long local_810;
  long local_808 [2];
  long *local_7f8;
  long local_7f0;
  long local_7e8 [2];
  pointer local_7d8;
  double local_7d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_780;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_750;
  long *local_720 [2];
  long local_710 [12];
  ios_base local_6b0 [264];
  undefined1 local_5a8 [1024];
  undefined1 local_1a8 [376];
  
  cmCTest::GetLabelsForSubprojects_abi_cxx11_(&local_7c8,(this->super_cmCTestGenericHandler).CTest);
  local_750._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_750._M_impl.super__Rb_tree_header._M_header;
  local_750._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_750._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_750._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_780._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_780._M_impl.super__Rb_tree_header._M_header;
  local_780._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_780._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_780._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_7b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_7b0._M_impl.super__Rb_tree_header._M_header;
  local_7b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_7b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_7b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar15 = (this->TestList).
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (this->TestList).
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_7b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_7b0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_780._M_impl.super__Rb_tree_header._M_header._M_right =
       local_780._M_impl.super__Rb_tree_header._M_header._M_left;
  local_750._M_impl.super__Rb_tree_header._M_header._M_right =
       local_750._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar15 == pcVar2) {
    cVar13 = '\x03';
  }
  else {
    uVar14 = 0;
    do {
      pbVar3 = (pcVar15->Labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__v = (pcVar15->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __v != pbVar3; __v = __v + 1) {
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_7c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_7c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__v);
        if ((_Var6._M_current !=
            local_7c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) == doSubProject) {
          if (uVar14 < __v->_M_string_length) {
            uVar14 = __v->_M_string_length;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_7b0,__v);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)&local_750,__v);
          *pmVar7 = 0.0;
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)&local_780,__v);
          *pmVar8 = 0;
        }
      }
      pcVar15 = pcVar15 + 1;
    } while (pcVar15 != pcVar2);
    cVar13 = (char)uVar14 + '\x03';
  }
  pcVar16 = (this->TestResults).
            super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_7d8 = (this->TestResults).
              super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar16 != local_7d8) {
    do {
      pbVar4 = (pcVar16->Properties->Labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__k_00 = (pcVar16->Properties->Labels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __k_00 != pbVar4; __k_00 = __k_00 + 1
          ) {
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_7b0,__k_00);
        if ((_Rb_tree_header *)cVar9._M_node != &local_7b0._M_impl.super__Rb_tree_header) {
          local_7d0 = (pcVar16->ExecutionTime).__r;
          iVar1 = pcVar16->Properties->Processors;
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)&local_750,__k_00);
          *pmVar7 = local_7d0 * (double)iVar1 + *pmVar7;
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)&local_780,__k_00);
          *pmVar8 = *pmVar8 + 1;
        }
      }
      pcVar16 = pcVar16 + 1;
    } while (pcVar16 != local_7d8);
  }
  if (local_7b0._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if (doSubProject) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5a8,"\nSubproject Time Summary:",0x19);
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x304,(char *)local_720[0],(this->super_cmCTestGenericHandler).Quiet);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5a8,"\nLabel Time Summary:",0x14);
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x307,(char *)local_720[0],(this->super_cmCTestGenericHandler).Quiet);
    }
    if (local_720[0] != local_710) {
      operator_delete(local_720[0],local_710[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a8);
    std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x70));
    if ((_Rb_tree_header *)local_7b0._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_7b0._M_impl.super__Rb_tree_header) {
      p_Var12 = local_7b0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_7f8 = local_7e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7f8,*(long *)(p_Var12 + 1),
                   (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
        std::__cxx11::string::resize((ulong)&local_7f8,cVar13);
        __k = p_Var12 + 1;
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)&local_750,(key_type *)__k);
        snprintf(local_5a8,0x400,"%6.2f sec*proc",*pmVar7);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_720,"(",1);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)&local_780,(key_type *)__k);
        poVar10 = (ostream *)std::ostream::operator<<((ostringstream *)local_720,*pmVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," test",5);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)&local_780,(key_type *)__k);
        if (1 < *pmVar8) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_720,"s",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_720,")",1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_7f8,local_7f0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
        sVar11 = strlen(local_5a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_5a8,sVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_818,local_810);
        if (local_818 != local_808) {
          operator_delete(local_818,local_808[0] + 1);
        }
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x31a,(char *)local_818,(this->super_cmCTestGenericHandler).Quiet);
        if (local_818 != local_808) {
          operator_delete(local_818,local_808[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        poVar10 = this->LogFile;
        if (poVar10 != (ostream *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,*(char **)(p_Var12 + 1),(long)p_Var12[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
          sVar11 = strlen(local_5a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_5a8,sVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
        if (local_7f8 != local_7e8) {
          operator_delete(local_7f8,local_7e8[0] + 1);
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != &local_7b0._M_impl.super__Rb_tree_header);
    }
    if (this->LogFile != (ostream *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->LogFile,"\n",1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a8,"\n",1);
    pcVar5 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x322,(char *)local_720[0],(this->super_cmCTestGenericHandler).Quiet);
    if (local_720[0] != local_710) {
      operator_delete(local_720[0],local_710[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a8);
    std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x70));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_7b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_780);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_750);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7c8);
  return;
}

Assistant:

void cmCTestTestHandler::PrintLabelOrSubprojectSummary(bool doSubProject)
{
  // collect subproject labels
  std::vector<std::string> subprojects =
    this->CTest->GetLabelsForSubprojects();
  std::map<std::string, double> labelTimes;
  std::map<std::string, int> labelCounts;
  std::set<std::string> labels;
  std::string::size_type maxlen = 0;
  // initialize maps
  for (cmCTestTestProperties& p : this->TestList) {
    for (std::string const& l : p.Labels) {
      // first check to see if the current label is a subproject label
      bool isSubprojectLabel = false;
      auto subproject = std::find(subprojects.begin(), subprojects.end(), l);
      if (subproject != subprojects.end()) {
        isSubprojectLabel = true;
      }
      // if we are doing sub projects and this label is one, then use it
      // if we are not doing sub projects and the label is not one use it
      if (doSubProject == isSubprojectLabel) {
        if (l.size() > maxlen) {
          maxlen = l.size();
        }
        labels.insert(l);
        labelTimes[l] = 0;
        labelCounts[l] = 0;
      }
    }
  }
  // fill maps
  for (cmCTestTestResult& result : this->TestResults) {
    cmCTestTestProperties& p = *result.Properties;
    for (std::string const& l : p.Labels) {
      // only use labels found in labels
      if (cm::contains(labels, l)) {
        labelTimes[l] +=
          result.ExecutionTime.count() * result.Properties->Processors;
        ++labelCounts[l];
      }
    }
  }
  // if no labels are found return and print nothing
  if (labels.empty()) {
    return;
  }
  // now print times
  if (doSubProject) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "\nSubproject Time Summary:", this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "\nLabel Time Summary:", this->Quiet);
  }
  for (std::string const& i : labels) {
    std::string label = i;
    label.resize(maxlen + 3, ' ');

    char buf[1024];
    snprintf(buf, sizeof(buf), "%6.2f sec*proc", labelTimes[i]);

    std::ostringstream labelCountStr;
    labelCountStr << "(" << labelCounts[i] << " test";
    if (labelCounts[i] > 1) {
      labelCountStr << "s";
    }
    labelCountStr << ")";
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "\n"
                         << label << " = " << buf << " "
                         << labelCountStr.str(),
                       this->Quiet);
    if (this->LogFile) {
      *this->LogFile << "\n" << i << " = " << buf << "\n";
    }
  }
  if (this->LogFile) {
    *this->LogFile << "\n";
  }
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "\n", this->Quiet);
}